

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

int run_container_rank(run_container_t *container,uint16_t x)

{
  uint uVar1;
  uint uVar2;
  uint32_t endpoint;
  uint32_t length;
  uint32_t startpoint;
  int i;
  uint32_t x32;
  int sum;
  uint16_t x_local;
  run_container_t *container_local;
  
  sum = 0;
  i = 0;
  while( true ) {
    if (container->n_runs <= i) {
      return sum;
    }
    uVar1 = (uint)container->runs[i].value;
    uVar2 = (uint)container->runs[i].length;
    if ((uint)x <= uVar2 + uVar1) break;
    sum = uVar2 + 1 + sum;
    i = i + 1;
  }
  if (x < uVar1) {
    return sum;
  }
  return sum + (x - uVar1) + 1;
}

Assistant:

int run_container_rank(const run_container_t *container, uint16_t x) {
    int sum = 0;
    uint32_t x32 = x;
    for (int i = 0; i < container->n_runs; i++) {
        uint32_t startpoint = container->runs[i].value;
        uint32_t length = container->runs[i].length;
        uint32_t endpoint = length + startpoint;
        if (x <= endpoint) {
            if (x < startpoint) break;
            return sum + (x32 - startpoint) + 1;
        } else {
            sum += length + 1;
        }
    }
    return sum;
}